

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lddgraph.hxx
# Opt level: O3

void __thiscall
lddgraph::lddrecurse
          (lddgraph *this,string *file,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *alreadyscanned,ofstream *gvstream)

{
  pointer pcVar1;
  char *__n;
  long *plVar2;
  string *psVar3;
  int iVar4;
  ostream *poVar5;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  pointer pbVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  bool bVar12;
  string temp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libraries;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  value_type local_188;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_168;
  ofstream *local_160;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158;
  long *local_140;
  char *local_138;
  long local_130 [2];
  pointer local_120;
  long *local_118;
  long local_110;
  long local_108 [2];
  long *local_f8;
  char *local_f0;
  long local_e8 [2];
  long *local_d8;
  long local_d0;
  long local_c8 [2];
  string local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  lddgraph *local_80;
  string *local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_70;
  ulong local_68;
  pointer local_60;
  char *local_58;
  pointer local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_168 = alreadyscanned;
  local_160 = gvstream;
  if (this->_quiet == false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Scanning file ",0xe);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(file->_M_dataplus)._M_p,file->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  local_158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ldd(this,file,&local_158);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_168,file);
  if (local_158.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_158.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_70 = &this->_ignorepatterns;
    uVar8 = 0;
    local_80 = this;
    local_78 = file;
    do {
      local_68 = uVar8;
      if ((local_158.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar8]._M_string_length != 0) &&
         (_Var6 = std::
                  __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                            ((this->_ignorelist).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             (this->_ignorelist).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                             local_158.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar8),
         _Var6._M_current ==
         (this->_ignorelist).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_48,local_70);
        local_d8 = local_c8;
        pcVar1 = local_158.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar8]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d8,pcVar1,
                   pcVar1 + local_158.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar8]._M_string_length);
        local_60 = local_48.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        pbVar7 = local_48.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          bVar12 = false;
        }
        else {
          do {
            local_118 = local_108;
            pcVar1 = (pbVar7->_M_dataplus)._M_p;
            local_50 = pbVar7;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_118,pcVar1,pcVar1 + pbVar7->_M_string_length);
            local_140 = local_130;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_140,local_d8,local_d0 + (long)local_d8);
            local_98.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_98.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_98.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
            local_188._M_string_length = 0;
            local_188.field_2._M_local_buf[0] = '\0';
            iVar4 = std::__cxx11::string::compare((char *)&local_118);
            lVar9 = local_110;
            plVar2 = local_118;
            bVar12 = true;
            if (iVar4 != 0) {
              if (local_138 < (char *)(local_110 - 1U)) {
                bVar12 = false;
              }
              else {
                if (local_110 != 0) {
                  lVar10 = 0;
                  do {
                    if ((*(char *)((long)plVar2 + lVar10) == '*') ||
                       (std::__cxx11::string::push_back((char)&local_188),
                       *(char *)((long)plVar2 + lVar10) == '*')) {
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back(&local_98,&local_188);
                      std::__cxx11::string::_M_replace
                                ((ulong)&local_188,0,(char *)local_188._M_string_length,0x10707b);
                    }
                    lVar10 = lVar10 + 1;
                  } while (lVar9 != lVar10);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&local_98,&local_188);
                pbVar7 = local_98.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                local_120 = local_98.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                if ((local_98.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_string_length == 0) {
                  pbVar7 = local_98.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 1;
                }
                else {
                  std::__cxx11::string::substr((ulong)&local_f8,(ulong)&local_140);
                  plVar2 = local_f8;
                  __n = (char *)pbVar7->_M_string_length;
                  if (__n == local_f0) {
                    if (__n == (char *)0x0) {
                      bVar11 = false;
                    }
                    else {
                      iVar4 = bcmp((pbVar7->_M_dataplus)._M_p,local_f8,(size_t)__n);
                      bVar11 = iVar4 != 0;
                    }
                  }
                  else {
                    bVar11 = true;
                  }
                  if (plVar2 != local_e8) {
                    operator_delete(plVar2,local_e8[0] + 1);
                  }
                  if (bVar11) {
LAB_0010563c:
                    bVar12 = false;
                    goto LAB_00105767;
                  }
                }
                if (pbVar7 != local_120) {
                  local_58 = local_138;
                  bVar11 = false;
                  do {
                    bVar12 = true;
                    std::__cxx11::string::_M_assign((string *)&local_188);
                    if ((char *)local_188._M_string_length == (char *)0x0) break;
                    lVar9 = (long)local_58 - local_188._M_string_length;
                    if (local_188._M_string_length < local_58) {
                      lVar10 = 0;
                      do {
                        std::__cxx11::string::substr((ulong)&local_f8,(ulong)&local_140);
                        plVar2 = local_f8;
                        if ((char *)local_188._M_string_length == local_f0) {
                          if ((char *)local_188._M_string_length == (char *)0x0) {
                            bVar12 = true;
                          }
                          else {
                            iVar4 = bcmp(local_188._M_dataplus._M_p,local_f8,
                                         local_188._M_string_length);
                            bVar12 = iVar4 == 0;
                          }
                        }
                        else {
                          bVar12 = false;
                        }
                        if (plVar2 != local_e8) {
                          operator_delete(plVar2,local_e8[0] + 1);
                        }
                        if (bVar12) {
                          bVar11 = true;
                          std::__cxx11::string::erase((ulong)&local_140,0);
                          goto LAB_00105753;
                        }
                        lVar10 = lVar10 + 1;
                      } while (lVar9 != lVar10);
                    }
                    if (!bVar11) goto LAB_0010563c;
LAB_00105753:
                    bVar12 = true;
                    pbVar7 = pbVar7 + 1;
                  } while (pbVar7 != local_120);
                }
              }
            }
LAB_00105767:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) {
              operator_delete(local_188._M_dataplus._M_p,
                              CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,
                                       local_188.field_2._M_local_buf[0]) + 1);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_98);
            if (local_140 != local_130) {
              operator_delete(local_140,local_130[0] + 1);
            }
            if (local_118 != local_108) {
              operator_delete(local_118,local_108[0] + 1);
            }
            pbVar7 = local_50 + 1;
          } while (!(bool)(pbVar7 == local_60 | bVar12));
        }
        if (local_d8 != local_c8) {
          operator_delete(local_d8,local_c8[0] + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_48);
        psVar3 = local_78;
        this = local_80;
        if (!bVar12) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_160,"\t\"",2);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_160,(psVar3->_M_dataplus)._M_p,
                              psVar3->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" -> \"",6);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,local_158.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar8]._M_dataplus.
                                     _M_p,
                              local_158.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar8]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          _Var6 = std::
                  __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                            ((local_168->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start,
                             (local_168->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish,
                             local_158.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar8);
          if (_Var6._M_current ==
              (local_168->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
            pcVar1 = local_158.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar8]._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b8,pcVar1,
                       pcVar1 + local_158.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar8]._M_string_length);
            lddrecurse(this,&local_b8,local_168,local_160);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
          }
        }
      }
      uVar8 = local_68 + 1;
    } while (uVar8 < (ulong)((long)local_158.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_158.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_158);
  return;
}

Assistant:

void lddrecurse(string file, vector<string> & alreadyscanned,
        ofstream & gvstream)
    {
      if (!_quiet)
        cout << "Scanning file " << file << endl;
      vector<string> libraries;
      ldd(file, libraries);
      alreadyscanned.push_back(file);
      for (int i = 0; i < libraries.size(); i++)
      {
        if (libraries[i].size() == 0 || contains(_ignorelist, libraries[i])
            || wildcardcontains(_ignorepatterns, libraries[i]))
          continue;
        gvstream << "\t\"" << file << "\" -> \"" << libraries[i] << "\""
            << endl;
        if (contains(alreadyscanned, libraries[i]))
          continue;
        lddrecurse(libraries[i], alreadyscanned, gvstream);
      }
    }